

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCastFromDecimal::Operation<short,int>
               (int16_t input,int32_t *result,CastParameters *parameters,uint8_t width,uint8_t scale
               )

{
  bool bVar1;
  
  bVar1 = TryCastDecimalToNumeric<short,int>(input,result,parameters,scale);
  return bVar1;
}

Assistant:

bool TryCastFromDecimal::Operation(int16_t input, int32_t &result, CastParameters &parameters, uint8_t width,
                                   uint8_t scale) {
	return TryCastDecimalToNumeric<int16_t, int32_t>(input, result, parameters, scale);
}